

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerStrictBrOrCm
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool noMathFastPath,bool isBranch,
          bool isHelper)

{
  LowererMD *this_00;
  Instr *pIVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  LabelInstr *pLVar7;
  LabelInstr *target;
  BranchInstr *pBVar8;
  RegOpnd *pRVar9;
  IndirOpnd *pIVar10;
  IntConstOpnd *pIVar11;
  RegOpnd *pRVar12;
  Opnd *pOVar13;
  LibraryValue LVar14;
  Lowerer *pLVar15;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  JnHelperMethod helperMethod_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_72;
  Opnd *local_70;
  LabelInstr *local_68;
  Instr *local_60;
  LibraryValue local_54;
  LabelInstr *local_50;
  LabelInstr *local_48;
  undefined4 local_3c;
  JnHelperMethod local_38;
  LibraryValue local_34;
  
  local_48 = (LabelInstr *)CONCAT44(local_48._4_4_,(int)CONCAT71(in_register_00000089,isHelper));
  local_3c = (undefined4)CONCAT71(in_register_00000081,isBranch);
  pIVar1 = instr->m_prev;
  bVar4 = IR::Instr::IsNeq(instr);
  local_34 = CONCAT31(local_34._1_3_,bVar4);
  pOVar2 = instr->m_src1;
  local_70 = instr->m_src2;
  local_38 = helperMethod;
  if (pOVar2 == (Opnd *)0x0 || local_70 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2947,"(src1 != nullptr && src2 != nullptr)","Expected 2 src opnds on BrC")
    ;
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  helperMethod_00 = local_38;
  local_60 = pIVar1;
  pLVar7 = IR::LabelInstr::New(Label,this->m_func,true);
  if (!noMathFastPath) {
    bVar4 = local_48._0_1_;
    local_50 = pLVar7;
    target = IR::Instr::GetOrCreateContinueLabel(instr,local_48._0_1_);
    if ((char)local_3c == '\0') {
      local_48 = IR::LabelInstr::New(Label,this->m_func,bVar4);
      local_68 = IR::LabelInstr::New(Label,this->m_func,bVar4);
      LVar14 = ValueFalse - (local_34 & 0xff);
      local_34 = (local_34 & 0xff) + ValueTrue;
    }
    else {
      pBVar8 = IR::Instr::AsBranchInstr(instr);
      local_48 = pBVar8->m_branchTarget;
      local_68 = target;
      if ((undefined1)local_34 != '\0') {
        local_48 = target;
        local_68 = pBVar8->m_branchTarget;
      }
      LVar14 = ValueInvalid;
      local_34 = ValueInvalid;
    }
    bVar4 = IR::Opnd::IsEqual(pOVar2,local_70);
    local_54 = LVar14;
    if (bVar4) {
      local_72 = (instr->m_src1->m_valueType).field_0;
      bVar4 = ValueType::IsNotFloat((ValueType *)&local_72.field_0);
      if (bVar4) {
        if ((char)local_3c == '\0') {
          pOVar2 = instr->m_dst;
          pOVar13 = LoadLibraryValueOpnd(this,instr,local_34);
          InsertMove(pOVar2,pOVar13,instr,true);
          InsertBranch(Br,target,instr);
        }
        else {
          pBVar8 = IR::BranchInstr::New(JMP,local_48,this->m_func);
          IR::Instr::InsertBefore(instr,&pBVar8->super_Instr);
        }
        pIVar1 = local_60;
        IR::Instr::Remove(instr);
        return pIVar1;
      }
      pRVar12 = IR::Opnd::AsRegOpnd(pOVar2);
      pLVar7 = local_50;
      LowererMD::GenerateObjectTest(&this->m_lowererMD,&pRVar12->super_Opnd,instr,local_50,false);
      pBVar8 = IR::BranchInstr::New(JMP,local_48,this->m_func);
      IR::Instr::InsertBefore(instr,&pBVar8->super_Instr);
    }
    else {
      this_00 = &this->m_lowererMD;
      pRVar12 = IR::Opnd::AsRegOpnd(pOVar2);
      pLVar15 = (Lowerer *)this_00;
      LowererMD::GenerateObjectTest(this_00,&pRVar12->super_Opnd,instr,local_50,false);
      InsertCompareBranch(pLVar15,pOVar2,local_70,BrEq_A,local_48,instr,false);
      pRVar12 = IR::RegOpnd::New(TyInt64,this->m_func);
      pRVar9 = IR::Opnd::AsRegOpnd(pOVar2);
      pIVar10 = IR::IndirOpnd::New(pRVar9,8,TyInt64,this->m_func,false);
      InsertMove(&pRVar12->super_Opnd,&pIVar10->super_Opnd,instr,true);
      pRVar9 = IR::RegOpnd::New(TyInt32,this->m_func);
      uVar5 = Js::Type::GetOffsetOfTypeId();
      pIVar10 = IR::IndirOpnd::New(pRVar12,uVar5,TyInt32,this->m_func,false);
      InsertMove(&pRVar9->super_Opnd,&pIVar10->super_Opnd,instr,true);
      pLVar15 = (Lowerer *)0x17;
      pIVar11 = IR::IntConstOpnd::New(0x17,TyInt32,this->m_func,true);
      pLVar7 = local_50;
      InsertCompareBranch(pLVar15,&pRVar9->super_Opnd,&pIVar11->super_Opnd,BrLe_A,local_50,instr,
                          false);
      pLVar15 = (Lowerer *)0x50;
      pIVar11 = IR::IntConstOpnd::New(0x50,TyInt32,this->m_func,true);
      InsertCompareBranch(pLVar15,&pRVar9->super_Opnd,&pIVar11->super_Opnd,BrEq_A,pLVar7,instr,false
                         );
      uVar5 = Js::Type::GetOffsetOfFlags();
      pIVar10 = IR::IndirOpnd::New(pRVar12,uVar5,TyInt8,this->m_func,false);
      pIVar11 = IR::IntConstOpnd::New(8,TyInt8,this->m_func,false);
      InsertTestBranch(&pIVar10->super_Opnd,&pIVar11->super_Opnd,BrNeq_A,pLVar7,instr);
      pOVar2 = local_70;
      bVar4 = IR::Opnd::IsRegOpnd(local_70);
      if (bVar4) {
        pRVar12 = IR::Opnd::AsRegOpnd(pOVar2);
        LowererMD::GenerateObjectTest(this_00,&pRVar12->super_Opnd,instr,pLVar7,false);
        pRVar12 = IR::RegOpnd::New(TyInt64,this->m_func);
        pRVar9 = IR::Opnd::AsRegOpnd(pOVar2);
        pIVar10 = IR::IndirOpnd::New(pRVar9,8,TyInt64,this->m_func,false);
        InsertMove(&pRVar12->super_Opnd,&pIVar10->super_Opnd,instr,true);
        uVar5 = Js::Type::GetOffsetOfFlags();
        pIVar10 = IR::IndirOpnd::New(pRVar12,uVar5,TyInt8,this->m_func,false);
        pLVar7 = local_50;
        pIVar11 = IR::IntConstOpnd::New(8,TyInt8,this->m_func,false);
        InsertTestBranch(&pIVar10->super_Opnd,&pIVar11->super_Opnd,BrNeq_A,pLVar7,instr);
      }
      pBVar8 = IR::BranchInstr::New(JMP,local_68,this->m_func);
      IR::Instr::InsertBefore(instr,&pBVar8->super_Instr);
    }
    helperMethod_00 = local_38;
    if ((char)local_3c != '\0') {
      IR::Instr::InsertBefore(instr,&pLVar7->super_Instr);
      goto LAB_00573646;
    }
    IR::Instr::InsertBefore(instr,&local_48->super_Instr);
    pOVar2 = instr->m_dst;
    pOVar13 = LoadLibraryValueOpnd(this,instr,local_34);
    InsertMove(pOVar2,pOVar13,instr,true);
    InsertBranch(Br,target,instr);
    IR::Instr::InsertBefore(instr,&local_68->super_Instr);
    pOVar2 = instr->m_dst;
    pOVar13 = LoadLibraryValueOpnd(this,instr,local_54);
    InsertMove(pOVar2,pOVar13,instr,true);
    helperMethod_00 = local_38;
    pLVar7 = local_50;
    InsertBranch(Br,target,instr);
  }
  IR::Instr::InsertBefore(instr,&pLVar7->super_Instr);
  if ((char)local_3c == '\0') {
    LowerBinaryHelperMem(this,instr,helperMethod_00);
    return local_60;
  }
LAB_00573646:
  LowerBrCMem(this,instr,helperMethod_00,true,true);
  return local_60;
}

Assistant:

IR::Instr *
Lowerer::LowerStrictBrOrCm(IR::Instr * instr, IR::JnHelperMethod helperMethod, bool noMathFastPath, bool isBranch, bool isHelper)
{
    IR::Instr * instrPrev = instr->m_prev;

    IR::LabelInstr * labelHelper = nullptr;
    IR::LabelInstr * labelFallThrough = nullptr;
    IR::LabelInstr * labelBranchSuccess = nullptr;
    IR::LabelInstr * labelBranchFailure = nullptr;
    LibraryValue successValueType = ValueInvalid;
    LibraryValue failureValueType = ValueInvalid;

    bool isEqual = !instr->IsNeq();
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * src2 = instr->GetSrc2();

    AssertMsg(src1 != nullptr && src2 != nullptr, "Expected 2 src opnds on BrC");

    labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    if (!noMathFastPath)
    {
        labelFallThrough = instr->GetOrCreateContinueLabel(isHelper);

        if (!isBranch)
        {
            labelBranchSuccess = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            labelBranchFailure = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            successValueType = isEqual ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
            failureValueType = isEqual ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;
        }
        else
        {
            labelBranchSuccess = isEqual ? instr->AsBranchInstr()->GetTarget() : labelFallThrough;
            labelBranchFailure = isEqual ? labelFallThrough : instr->AsBranchInstr()->GetTarget();
        }

        if (src1->IsEqual(src2))
        {
            if (instr->GetSrc1()->GetValueType().IsNotFloat())
            {
                if (!isBranch)
                {
                    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, successValueType), instr);
                    InsertBranch(Js::OpCode::Br, labelFallThrough, instr);
                }
                else
                {
                    IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchSuccess, this->m_func);
                    instr->InsertBefore(branch);
                }
                instr->Remove();
                return instrPrev;
            }
#if !FLOATVAR
            m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper);
            IR::RegOpnd *src1TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            Lowerer::InsertMove(src1TypeReg, IR::IndirOpnd::New(src1->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func), instr);

            // MOV src1TypeIdReg, [src1TypeReg + offset(typeId)]
            IR::RegOpnd *src1TypeIdReg = IR::RegOpnd::New(TyInt32, this->m_func);
            Lowerer::InsertMove(src1TypeIdReg, IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func), instr);

            // CMP src1TypeIdReg, TypeIds_Number
            // JEQ $helper
            IR::IntConstOpnd *numberTypeId = IR::IntConstOpnd::New(Js::TypeIds_Number, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, numberTypeId, Js::OpCode::BrEq_A, labelHelper, instr);
#else
            m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper);
#endif
            IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchSuccess, this->m_func);
            instr->InsertBefore(branch);
        }
        else
        {
            m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper);

#if !FLOATVAR
            IR::RegOpnd *src1TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            Lowerer::InsertMove(src1TypeReg, IR::IndirOpnd::New(src1->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func), instr);

            // MOV src1TypeIdReg, [src1TypeReg + offset(typeId)]
            IR::RegOpnd *src1TypeIdReg = IR::RegOpnd::New(TyInt32, this->m_func);
            Lowerer::InsertMove(src1TypeIdReg, IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func), instr);

            // CMP src1TypeIdReg, TypeIds_Number
            // JEQ $helper
            IR::IntConstOpnd *numberTypeId = IR::IntConstOpnd::New(Js::TypeIds_Number, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, numberTypeId, Js::OpCode::BrEq_A, labelHelper, instr);
#endif
            //      CMP src1, src2                       - Ptr comparison
            //      JEQ $branchSuccess
            InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);

#if FLOATVAR
            IR::RegOpnd *src1TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            Lowerer::InsertMove(src1TypeReg, IR::IndirOpnd::New(src1->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func), instr);

            // MOV src1TypeIdReg, [src1TypeReg + offset(typeId)]
            IR::RegOpnd *src1TypeIdReg = IR::RegOpnd::New(TyInt32, this->m_func);
            Lowerer::InsertMove(src1TypeIdReg, IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func), instr);
#endif
            // CMP src1TypeIdReg, TypeIds_HostDispatch
            // JLE $helper (le condition covers string, int64, uint64, hostdispatch, as well as undefined, null, boolean)
            IR::IntConstOpnd *hostDispatchTypeId = IR::IntConstOpnd::New(Js::TypeIds_HostDispatch, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, hostDispatchTypeId, Js::OpCode::BrLe_A, labelHelper, instr);

            // CMP src1TypeIdReg, TypeIds_GlobalObject
            // JE $helper
            IR::IntConstOpnd *globalObjectTypeId = IR::IntConstOpnd::New(Js::TypeIds_GlobalObject, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, globalObjectTypeId, Js::OpCode::BrEq_A, labelHelper, instr);

            // TEST src1TypeReg->flags, TypeFlagMask_EngineExternal
            // JE $helper

            IR::Opnd *flags = IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfFlags(), TyInt8, this->m_func);
            InsertTestBranch(flags, IR::IntConstOpnd::New(TypeFlagMask_EngineExternal, TyInt8, this->m_func), Js::OpCode::BrNeq_A, labelHelper, instr);

            if (src2->IsRegOpnd())
            {
                m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper);
                // MOV src2TypeReg, [src2 + offset(type)]
                // TEST [src2TypeReg + offset(flags)], TypeFlagMask_EngineExternal
                // JE $helper
                IR::RegOpnd *src2TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
                IR::IndirOpnd *src2Type = IR::IndirOpnd::New(src2->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func);
                Lowerer::InsertMove(src2TypeReg, src2Type, instr);
                IR::Opnd *src2Flags = IR::IndirOpnd::New(src2TypeReg, Js::Type::GetOffsetOfFlags(), TyInt8, this->m_func);
                InsertTestBranch(src2Flags, IR::IntConstOpnd::New(TypeFlagMask_EngineExternal, TyInt8, this->m_func), Js::OpCode::BrNeq_A, labelHelper, instr);
            }

            // JMP $done
            IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchFailure, this->m_func);
            instr->InsertBefore(branch);
        }

        if (!isBranch)
        {
            instr->InsertBefore(labelBranchSuccess);
            InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, successValueType), instr);
            InsertBranch(Js::OpCode::Br, labelFallThrough, instr);

            instr->InsertBefore(labelBranchFailure);
            InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, failureValueType), instr);
            InsertBranch(Js::OpCode::Br, labelFallThrough, instr);
        }
    }

    instr->InsertBefore(labelHelper);

    if (isBranch)
    {
        LowerBrCMem(instr, helperMethod, true, true);
    }
    else
    {
        LowerBinaryHelperMem(instr, helperMethod);
    }

    return instrPrev;
}